

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::CheckAlign
          (Validator *this,Location *loc,Address alignment,Address natural_alignment)

{
  bool bVar1;
  Address natural_alignment_local;
  Address alignment_local;
  Location *loc_local;
  Validator *this_local;
  
  if (alignment != 0xffffffff) {
    bVar1 = is_power_of_two(alignment);
    if (!bVar1) {
      PrintError(this,loc,"alignment must be power-of-two");
    }
    if (natural_alignment < alignment) {
      PrintError(this,loc,"alignment must not be larger than natural alignment (%u)",
                 (ulong)natural_alignment);
    }
  }
  return;
}

Assistant:

void Validator::CheckAlign(const Location* loc,
                           Address alignment,
                           Address natural_alignment) {
  if (alignment != WABT_USE_NATURAL_ALIGNMENT) {
    if (!is_power_of_two(alignment)) {
      PrintError(loc, "alignment must be power-of-two");
    }
    if (alignment > natural_alignment) {
      PrintError(loc,
                 "alignment must not be larger than natural alignment (%u)",
                 natural_alignment);
    }
  }
}